

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int generate_script_from_miniscript
              (miniscript_node_t *node,miniscript_node_t *parent,uint32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  uint uVar1;
  char *path;
  long lVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  size_t *astarisk_index_00;
  int8_t astarisk_index;
  size_t output_len;
  uint32_t count;
  uchar pubkey [33];
  uchar bip32_serialized [82];
  ext_key derive_extkey;
  uchar privkey [38];
  char local_639;
  size_t local_638;
  uint local_62c;
  uchar *local_628;
  size_t *local_620;
  ext_key local_618;
  uchar local_558 [96];
  ext_key local_4f8;
  undefined4 local_438;
  char local_417;
  
  local_638 = 0;
  if (node->info == (miniscript_item_t *)0x0) {
    uVar1 = node->kind;
    if (uVar1 == 0x1020 || (uVar1 & 4) != 0) {
      iVar3 = wally_hex_to_bytes(node->data,script,script_len,write_len);
      if (iVar3 != 0) {
        return iVar3;
      }
      if (node->kind != 0x1020) {
        return 0;
      }
      if (*write_len == 0x20) {
        node->is_xonly_key = true;
        return 0;
      }
      if (*write_len == 0x41) {
        node->is_uncompress_key = true;
        return 0;
      }
      return 0;
    }
    if ((int)uVar1 < 0x210) {
      if (uVar1 == 8) {
        iVar3 = generate_script_from_number(node->number,parent,script,script_len,write_len);
        return iVar3;
      }
      if (uVar1 == 0x110) {
LAB_00169bfb:
        iVar3 = analyze_miniscript_addr
                          (node->data,(miniscript_node_t *)0x0,(miniscript_node_t *)0x0,
                           (address_script_t *)0x0,script,script_len,write_len);
        return iVar3;
      }
    }
    else {
      if (uVar1 == 0x210) goto LAB_00169bfb;
      if (uVar1 == 0x2020) {
        if ((0x40 < script_len) &&
           ((iVar3 = wally_base58_to_bytes(node->data,1,(uchar *)&local_438,0x26,&local_638),
            iVar3 != 0 || (0x20 < local_638)))) {
          iVar3 = wally_ec_public_key_from_private_key
                            ((uchar *)((long)&local_438 + 1),0x20,local_618.chain_code,0x21);
          if (iVar3 != 0) {
            return iVar3;
          }
          if ((node->network_type & 0xfffffffd) == 0) {
            node->network_type = 2;
            if ((local_638 == 0x22) && (local_417 == '\x01')) {
              if (node->is_xonly_key == true) {
                *(ulong *)(script + 0x10) =
                     CONCAT17(local_618.chain_code[0x18],local_618.chain_code._17_7_);
                *(ulong *)(script + 0x18) =
                     CONCAT17(local_618.parent160[0],local_618.chain_code._25_7_);
                *(ulong *)script = CONCAT17(local_618.chain_code[8],local_618.chain_code._1_7_);
                *(ulong *)(script + 8) =
                     CONCAT17(local_618.chain_code[0x10],local_618.chain_code._9_7_);
                *write_len = 0x20;
                return 0;
              }
              script[0x20] = local_618.parent160[0];
              *(ulong *)(script + 0x10) =
                   CONCAT71(local_618.chain_code._17_7_,local_618.chain_code[0x10]);
              *(ulong *)(script + 0x18) =
                   CONCAT71(local_618.chain_code._25_7_,local_618.chain_code[0x18]);
              *(ulong *)script = CONCAT71(local_618.chain_code._1_7_,local_618.chain_code[0]);
              *(ulong *)(script + 8) = CONCAT71(local_618.chain_code._9_7_,local_618.chain_code[8]);
              *write_len = 0x21;
              return 0;
            }
            iVar3 = wally_ec_public_key_decompress(local_618.chain_code,0x21,script,0x41);
            if (iVar3 == 0) {
              *write_len = 0x41;
              node->is_uncompress_key = true;
              return 0;
            }
            return iVar3;
          }
        }
        return -2;
      }
    }
    if ((~uVar1 & 0x4020) != 0) {
      return -2;
    }
    local_639 = -1;
    local_62c = 0;
    astarisk_index_00 = write_len;
    wally_bzero(&local_618,0xc0);
    wally_bzero(&local_4f8,0xc0);
    iVar3 = wally_base58_to_bytes(node->data,1,local_558,0x52,&local_638);
    if (iVar3 != 0) {
      return iVar3;
    }
    if (0x52 < local_638) {
      return -2;
    }
    iVar3 = bip32_key_unserialize(local_558,local_638,&local_618);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = node->kind;
    if ((local_618.version == 0x488ade4 && iVar3 == 0x14020) ||
       (local_618.version == 0x488b21e && iVar3 != 0x14020)) {
      if (1 < node->network_type) {
        return -2;
      }
      node->network_type = 1;
    }
    else {
      if ((node->network_type & 0xfffffffd) != 0) {
        return -2;
      }
      node->network_type = 2;
    }
    path = node->derive_path;
    if ((path != (char *)0x0) && (*path != '\0')) {
      iVar3 = convert_bip32_path_to_array
                        (path,&local_438,(uint)(iVar3 == 0x14020),SUB81(&local_62c,0),
                         (uint32_t *)&local_639,(int8_t *)astarisk_index_00);
      if (iVar3 != 0) {
        return iVar3;
      }
      if (-1 < (long)local_639) {
        (&local_438)[local_639] = (&local_438)[local_639] | derive_child_num;
      }
      iVar3 = bip32_key_from_parent_path(&local_618,&local_438,(ulong)local_62c,1,&local_4f8);
      if (iVar3 != 0) {
        return iVar3;
      }
      memcpy(&local_618,&local_4f8,0xc0);
    }
    if (node->is_xonly_key == true) {
      *(ulong *)(script + 0x10) = CONCAT17(local_618.pub_key[0x18],local_618.pub_key._17_7_);
      *(ulong *)(script + 0x18) = CONCAT17(local_618.pub_key[0x20],local_618.pub_key._25_7_);
      *(ulong *)script = CONCAT17(local_618.pub_key[8],local_618.pub_key._1_7_);
      *(ulong *)(script + 8) = CONCAT17(local_618.pub_key[0x10],local_618.pub_key._9_7_);
      sVar6 = 0x20;
    }
    else {
      script[0x20] = local_618.pub_key[0x20];
      *(ulong *)(script + 0x10) = CONCAT71(local_618.pub_key._17_7_,local_618.pub_key[0x10]);
      *(ulong *)(script + 0x18) = CONCAT71(local_618.pub_key._25_7_,local_618.pub_key[0x18]);
      *(ulong *)script = CONCAT71(local_618.pub_key._1_7_,local_618.pub_key[0]);
      *(ulong *)(script + 8) = CONCAT71(local_618.pub_key._9_7_,local_618.pub_key[8]);
      sVar6 = 0x21;
    }
    *write_len = sVar6;
  }
  else {
    local_638 = *write_len;
    iVar3 = (*node->info->generate_function)
                      (node,parent,derive_child_num,script,script_len,&local_638);
    if (iVar3 != 0) {
      return iVar3;
    }
    local_620 = write_len;
    if ((node->wrapper != 0) && (sVar4 = strlen(node->wrapper_str), sVar4 != 0)) {
      do {
        lVar2 = sVar4 - 1;
        sVar4 = sVar4 - 1;
        lVar5 = 0x20;
        while (**(char **)(&g_network_address_table[3].network + lVar5) != node->wrapper_str[lVar2])
        {
          lVar5 = lVar5 + 0x28;
          if (lVar5 == 0x1b0) {
            return -2;
          }
        }
        local_628 = script;
        iVar3 = (**(code **)((long)&miniscript_wrapper_table[0].name + lVar5))
                          (script,script_len,&local_638);
        if (iVar3 != 0) {
          return iVar3;
        }
        script = local_628;
      } while (sVar4 != 0);
    }
    *local_620 = local_638;
  }
  return 0;
}

Assistant:

static int generate_script_from_miniscript(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    uint32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t output_len = 0;
    size_t len;
    size_t index;
    size_t table_idx;
    size_t max;
    const struct miniscript_wrapper_item_t *item = NULL;

    if (node->info) {
        output_len = *write_len;
        ret = node->info->generate_function(node, parent, derive_child_num, script,
                                            script_len, &output_len);
        if (ret != WALLY_OK)
            return ret;

        if (node->wrapper != 0) {
            /* back from wrapper string */
            max = sizeof(miniscript_wrapper_table) / sizeof(struct miniscript_item_t);
            len = strlen(node->wrapper_str);
            for (index = len; index > 0; --index) {
                item = NULL;
                for (table_idx = 0; table_idx < max; ++table_idx) {
                    if (miniscript_wrapper_table[table_idx].name[0] == node->wrapper_str[index - 1]) {
                        item = &miniscript_wrapper_table[table_idx];
                        break;
                    }
                }
                if (!item) {
                    return WALLY_EINVAL;
                }

                ret = item->generate_function(script, script_len, &output_len);
                if (ret != WALLY_OK)
                    return ret;
            }
        }
        *write_len = output_len;
        return ret;
    }

    /* value data */
    if ((node->kind & DESCRIPTOR_KIND_RAW) || (node->kind == DESCRIPTOR_KIND_PUBLIC_KEY)) {
        ret = wally_hex_to_bytes(node->data, script, script_len, write_len);
        if (((ret == WALLY_OK)) && (node->kind == DESCRIPTOR_KIND_PUBLIC_KEY)) {
            if (*write_len == EC_PUBLIC_KEY_UNCOMPRESSED_LEN)
                node->is_uncompress_key = true;
            else if (*write_len == XONLY_PUBLIC_KEY_LEN)
                node->is_xonly_key = true;
        }
    } else if (node->kind == DESCRIPTOR_KIND_NUMBER) {
        ret = generate_script_from_number(node->number, parent, script, script_len, write_len);
    } else if ((node->kind == DESCRIPTOR_KIND_BASE58) || (node->kind == DESCRIPTOR_KIND_BECH32)) {
        ret = analyze_miniscript_addr(node->data, NULL, NULL, NULL, script, script_len, write_len);
    } else if (node->kind == DESCRIPTOR_KIND_PRIVATE_KEY) {
        unsigned char privkey[2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN];
        unsigned char pubkey[EC_PUBLIC_KEY_LEN];
        if (script_len < EC_PUBLIC_KEY_UNCOMPRESSED_LEN)
            return WALLY_EINVAL;

        ret = wally_base58_to_bytes(node->data, BASE58_FLAG_CHECKSUM, privkey,
                                    sizeof(privkey), &output_len);
        if ((ret == WALLY_OK) && (output_len < EC_PRIVATE_KEY_LEN + 1))
            return WALLY_EINVAL;

        ret = wally_ec_public_key_from_private_key(&privkey[1], EC_PRIVATE_KEY_LEN,
                                                   pubkey, sizeof(pubkey));
        if (ret == WALLY_OK) {
            if (privkey[0] == WALLY_ADDRESS_VERSION_WIF_MAINNET) {
                if ((node->network_type != 0) && (node->network_type != WALLY_NETWORK_BITCOIN_MAINNET))
                    return WALLY_EINVAL;
                node->network_type = WALLY_NETWORK_BITCOIN_MAINNET;
            } else {
                if ((node->network_type != 0) && (node->network_type != WALLY_NETWORK_BITCOIN_TESTNET))
                    return WALLY_EINVAL;
                node->network_type = WALLY_NETWORK_BITCOIN_TESTNET;
            }
        }
        if (ret == WALLY_OK) {
            if ((output_len == EC_PRIVATE_KEY_LEN + 2) && (privkey[EC_PRIVATE_KEY_LEN + 1] == 1)) {
                if (node->is_xonly_key) {
                    memcpy(script, &pubkey[1], XONLY_PUBLIC_KEY_LEN);
                    *write_len = XONLY_PUBLIC_KEY_LEN;
                } else {
                    memcpy(script, pubkey, EC_PUBLIC_KEY_LEN);
                    *write_len = EC_PUBLIC_KEY_LEN;
                }
            } else {
                ret = wally_ec_public_key_decompress(pubkey, sizeof(pubkey), script,
                                                     EC_PUBLIC_KEY_UNCOMPRESSED_LEN);
                if (ret == WALLY_OK) {
                    *write_len = EC_PUBLIC_KEY_UNCOMPRESSED_LEN;
                    node->is_uncompress_key = true;
                }
            }
        }
    } else if ((node->kind & DESCRIPTOR_KIND_BIP32) == DESCRIPTOR_KIND_BIP32) {
        unsigned char bip32_serialized[BIP32_SERIALIZED_LEN + BASE58_CHECKSUM_LEN];
        struct ext_key extkey;
        struct ext_key derive_extkey;
        uint32_t bip32_array[DESCRIPTOR_BIP32_PATH_NUM_MAX];
        int8_t astarisk_index = -1;
        uint32_t count = 0;

        wally_bzero(&extkey, sizeof(struct ext_key));
        wally_bzero(&derive_extkey, sizeof(struct ext_key));
        ret = wally_base58_to_bytes(node->data, BASE58_FLAG_CHECKSUM,
                                    bip32_serialized, sizeof(bip32_serialized), &output_len);
        if (ret != WALLY_OK)
            return ret;
        if (output_len > sizeof(bip32_serialized))
            return WALLY_EINVAL;

        ret = bip32_key_unserialize(bip32_serialized, output_len, &extkey);
        if (ret != WALLY_OK)
            return ret;

        if (((node->kind == DESCRIPTOR_KIND_BIP32_PRIVATE_KEY) && (extkey.version == BIP32_VER_MAIN_PRIVATE)) ||
            ((node->kind != DESCRIPTOR_KIND_BIP32_PRIVATE_KEY) && (extkey.version == BIP32_VER_MAIN_PUBLIC))) {
            if (node->network_type != 0 && node->network_type != WALLY_NETWORK_BITCOIN_MAINNET) {
                return WALLY_EINVAL;
            }
            node->network_type = WALLY_NETWORK_BITCOIN_MAINNET;
        } else {
            if (node->network_type != 0 && node->network_type != WALLY_NETWORK_BITCOIN_TESTNET) {
                return WALLY_EINVAL;
            }
            node->network_type = WALLY_NETWORK_BITCOIN_TESTNET;
        }

        if (node->derive_path && node->derive_path[0] != '\0') {
            ret = convert_bip32_path_to_array(node->derive_path, bip32_array,
                                              DESCRIPTOR_BIP32_PATH_NUM_MAX,
                                              (node->kind == DESCRIPTOR_KIND_BIP32_PRIVATE_KEY),
                                              &count, &astarisk_index);
            if (ret != WALLY_OK)
                return ret;

            if (astarisk_index >= 0)
                bip32_array[astarisk_index] |= derive_child_num;

            ret = bip32_key_from_parent_path(&extkey, bip32_array, count,
                                             BIP32_FLAG_KEY_PUBLIC, &derive_extkey);
            if (ret != WALLY_OK)
                return ret;

            memcpy(&extkey, &derive_extkey, sizeof(extkey));
        }
        if (node->is_xonly_key) {
            memcpy(script, &extkey.pub_key[1], XONLY_PUBLIC_KEY_LEN);
            *write_len = XONLY_PUBLIC_KEY_LEN;
        } else {
            memcpy(script, extkey.pub_key, EC_PUBLIC_KEY_LEN);
            *write_len = EC_PUBLIC_KEY_LEN;
        }
    } else {
        return WALLY_EINVAL;
    }

    return ret;
}